

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::removeMapPointer(CLIntercept *this,void *ptr)

{
  long in_RSI;
  map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
  *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  if (in_RSI != 0) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffc8);
    std::
    map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
    ::erase(in_RDI,(key_type *)in_stack_ffffffffffffffc8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x212485);
  }
  return;
}

Assistant:

void CLIntercept::removeMapPointer(
    const void* ptr )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_MapPointerInfoMap.erase(ptr);
    }
}